

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O2

feed_db_status_t import_csv_file_db(char *path,char *table,feed_db_t *db)

{
  char **ppcVar1;
  feed_db_t *pfVar2;
  uint field_count;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  ulong sz;
  sqlite3_stmt *stmt;
  int local_64;
  char **record_values;
  char **field_names;
  feed_db_t *local_50;
  char *insert_query;
  char *error_msg;
  char *create_query;
  
  __stream = fopen(path,"r");
  if (__stream == (FILE *)0x0) {
    pcVar4 = "Failed to open .csv file";
  }
  else {
    record_values = (char **)0x0;
    local_64 = count_lines((FILE *)__stream);
    if (local_64 < 1) {
      fclose(__stream);
      pcVar4 = "Failed to count lines in CSV file";
    }
    else {
      field_names = (char **)0x0;
      field_count = read_header((FILE *)__stream,&field_names);
      if (-1 < (int)field_count) {
        bake_create_uni_query_db(table,field_count,field_names,&create_query);
        iVar6 = 0;
        iVar3 = sqlite3_exec(db->conn,create_query,(sqlite3_callback)0x0,(void *)0x0,&error_msg);
        db->rc = iVar3;
        free(create_query);
        sz = (ulong)field_count;
        free_cstr_arr(field_names,sz);
        if (db->rc != 0) {
          if (error_msg == (char *)0x0) {
            pcVar4 = strdup("Failed to create a table");
            db->error_msg = pcVar4;
          }
          else {
            pcVar4 = strdup(error_msg);
            db->error_msg = pcVar4;
            sqlite3_free(error_msg);
          }
          fclose(__stream);
          return FEED_DB_ERROR;
        }
        local_64 = local_64 + -1;
        bake_insert_uni_query_db(table,field_count,&insert_query);
        local_50 = db;
        sqlite3_prepare_v2(db->conn,insert_query,-1,&stmt,(char **)0x0);
        do {
          if (iVar6 == local_64) {
            sqlite3_finalize(stmt);
            free(insert_query);
            fclose(__stream);
            return FEED_DB_SUCCESS;
          }
          iVar3 = read_record((FILE *)__stream,field_count,&record_values);
          if (0 < iVar3) {
            uVar5 = 0;
            while (sz != uVar5) {
              ppcVar1 = record_values + uVar5;
              uVar5 = uVar5 + 1;
              sqlite3_bind_text(stmt,(int)uVar5,*ppcVar1,-1,(_func_void_void_ptr *)0x0);
            }
            iVar3 = sqlite3_step(stmt);
            local_50->rc = iVar3;
            if (iVar3 != 0x65) {
              fclose(__stream);
              free(insert_query);
              free_cstr_arr(record_values,sz);
              pfVar2 = local_50;
              pcVar4 = sqlite3_errmsg(local_50->conn);
              pcVar4 = strdup(pcVar4);
              pfVar2->error_msg = pcVar4;
              sqlite3_finalize(stmt);
              return FEED_DB_ERROR;
            }
            sqlite3_clear_bindings(stmt);
            sqlite3_reset(stmt);
          }
          free_cstr_arr(record_values,sz);
          iVar6 = iVar6 + 1;
        } while( true );
      }
      free_cstr_arr(field_names,(long)(int)field_count);
      fclose(__stream);
      pcVar4 = "Failed to read CSV file header";
    }
  }
  pcVar4 = strdup(pcVar4);
  db->error_msg = pcVar4;
  return FEED_DB_ERROR;
}

Assistant:

feed_db_status_t import_csv_file_db(const char *path, const char *table, feed_db_t *db) {
    FILE *fp = fopen(path, "r");

    if (!fp) {
        db->error_msg = strdup("Failed to open .csv file");
        return FEED_DB_ERROR;
    }

    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    if (lines_count < 0) {
        free(record_values);
        fclose(fp);

        db->error_msg = strdup("Failed to count lines in CSV file");
        return FEED_DB_ERROR;
    }

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        fclose(fp);

        db->error_msg = strdup("Failed to read CSV file header");
        return FEED_DB_ERROR;
    }

    // begin_transaction_db(db);

    char *create_query;
    bake_create_uni_query_db(table, field_count, field_names, &create_query);

    char *error_msg;
    db->rc = sqlite3_exec(db->conn, create_query, NULL, NULL, &error_msg);

    free(create_query);
    free_cstr_arr(field_names, field_count);

    if (db->rc) {
        if (error_msg != NULL) {
            db->error_msg = strdup(error_msg);
            sqlite3_free(error_msg);
        } else {
            db->error_msg = strdup("Failed to create a table");
        }
        fclose(fp);
        free(record_values);
        return FEED_DB_ERROR;
    }

    char *insert_query;
    bake_insert_uni_query_db(table, field_count, &insert_query);

    sqlite3_stmt *stmt;
    sqlite3_prepare_v2(db->conn, insert_query, -1, &stmt, NULL);

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            for (int j = 0; j < field_count; j++)
                sqlite3_bind_text(stmt, j + 1, record_values[j], -1, SQLITE_STATIC);

            db->rc = sqlite3_step(stmt);
            if (db->rc != SQLITE_DONE) {
                fclose(fp);
                free(insert_query);
                free_cstr_arr(record_values, field_count);
                db->error_msg = strdup(sqlite3_errmsg(db->conn));
                sqlite3_finalize(stmt);
                return FEED_DB_ERROR;
            }

            sqlite3_clear_bindings(stmt);
            sqlite3_reset(stmt);
            record_count++;
        }
        free_cstr_arr(record_values, field_count);
    }

    sqlite3_finalize(stmt);

    // end_transaction_db(db);

    free(insert_query);
    fclose(fp);

    return FEED_DB_SUCCESS;
}